

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

size_t cmCTestSubmitHandlerWriteMemoryCallback(void *ptr,size_t size,size_t nmemb,void *data)

{
  int iVar1;
  char *chPtr;
  int realsize;
  void *data_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  iVar1 = (int)size * (int)nmemb;
  cm::append<std::vector<char,_std::allocator<char>_>,_const_char_*,_0>
            ((vector<char,_std::allocator<char>_> *)data,(char *)ptr,
             (char *)((long)ptr + (long)iVar1));
  return (long)iVar1;
}

Assistant:

static size_t cmCTestSubmitHandlerWriteMemoryCallback(void* ptr, size_t size,
                                                      size_t nmemb, void* data)
{
  int realsize = static_cast<int>(size * nmemb);
  const char* chPtr = static_cast<char*>(ptr);
  cm::append(*static_cast<cmCTestSubmitHandlerVectorOfChar*>(data), chPtr,
             chPtr + realsize);
  return realsize;
}